

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v6::internal::bigint::assign_pow10(bigint *this,int exp)

{
  uint uVar1;
  uint in_ESI;
  uint64_t in_RDI;
  bigint *unaff_retaddr;
  int bitmask;
  bigint *in_stack_00000018;
  bigint *in_stack_00000100;
  int iVar2;
  
  if (in_ESI == 0) {
    assign(unaff_retaddr,in_RDI);
  }
  else {
    for (iVar2 = 1; iVar2 <= (int)in_ESI; iVar2 = iVar2 << 1) {
    }
    uVar1 = iVar2 >> 1;
    assign(unaff_retaddr,in_RDI);
    while( true ) {
      uVar1 = (int)uVar1 >> 1;
      if (uVar1 == 0) break;
      square(in_stack_00000100);
      if ((in_ESI & uVar1) != 0) {
        operator*=((bigint *)CONCAT44(in_ESI,uVar1),(int)(in_RDI >> 0x20));
      }
    }
    operator<<=(in_stack_00000018,this._4_4_);
  }
  return;
}

Assistant:

void assign_pow10(int exp) {
    assert(exp >= 0);
    if (exp == 0) return assign(1);
    // Find the top bit.
    int bitmask = 1;
    while (exp >= bitmask) bitmask <<= 1;
    bitmask >>= 1;
    // pow(10, exp) = pow(5, exp) * pow(2, exp). First compute pow(5, exp) by
    // repeated squaring and multiplication.
    assign(5);
    bitmask >>= 1;
    while (bitmask != 0) {
      square();
      if ((exp & bitmask) != 0) *this *= 5;
      bitmask >>= 1;
    }
    *this <<= exp;  // Multiply by pow(2, exp) by shifting.
  }